

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
     *this,int i)

{
  value_type vVar1;
  double dVar2;
  value_type vVar3;
  double dVar4;
  
  vVar1 = FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>::dx(&this->left_->fadexpr_,i);
  dVar2 = cos((this->right_->fadexpr_).expr_.val_);
  vVar3 = FadFuncCos<Fad<double>_>::dx(&this->right_->fadexpr_,i);
  dVar4 = cos((((this->left_->fadexpr_).expr_)->fadexpr_).expr_.val_);
  return dVar2 * vVar1 - dVar4 * vVar3;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}